

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O3

void * UNPK_openArchive(PHYSFS_Io *io)

{
  int iVar1;
  __PHYSFS_DirTree *dt;
  
  dt = (__PHYSFS_DirTree *)(*__PHYSFS_AllocatorHooks.Malloc)(0x28);
  if (dt == (__PHYSFS_DirTree *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    iVar1 = __PHYSFS_DirTreeInit(dt,0x48);
    if (iVar1 != 0) {
      dt[1].root = (__PHYSFS_DirTreeEntry *)io;
      return dt;
    }
    (*__PHYSFS_AllocatorHooks.Free)(dt);
  }
  return (void *)0x0;
}

Assistant:

void *UNPK_openArchive(PHYSFS_Io *io)
{
    UNPKinfo *info = (UNPKinfo *) allocator.Malloc(sizeof (UNPKinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    if (!__PHYSFS_DirTreeInit(&info->tree, sizeof (UNPKentry)))
    {
        allocator.Free(info);
        return NULL;
    } /* if */

    info->io = io;

    return info;
}